

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

Oop __thiscall Lodtalk::MethodCompiler::visitMethodAST(MethodCompiler *this,MethodAST *node)

{
  Assembler *pAVar1;
  VMContext *pVVar2;
  pointer ppPVar3;
  pointer ppPVar4;
  PragmaDefinition *this_00;
  uint8_t *puVar5;
  LiteralNode *this_01;
  element_type *peVar6;
  undefined8 *puVar7;
  bool bVar8;
  int iVar9;
  MethodHeader *this_02;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar10;
  ArgumentList *this_03;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *pvVar11;
  PragmaList *this_04;
  Pragmas *pPVar12;
  ObjectHeader *pOVar13;
  string *psVar14;
  Parameters *pPVar15;
  Oop OVar16;
  pointer ppNVar17;
  LocalVariables *pLVar18;
  pointer psVar19;
  LocalVariables *pLVar20;
  SequenceNode *pSVar21;
  char *__function;
  long lVar22;
  LiteralNode *this_05;
  long lVar23;
  size_t sVar24;
  ulong uVar25;
  Ref<Lodtalk::Pragma> pragmaObject;
  bool local_90;
  ulong local_88;
  size_t local_80;
  undefined1 local_60 [32];
  long local_40;
  Pragmas *local_38;
  
  this->localContext = &node->super_FunctionalNode;
  this->temporalVectorCount = 0;
  this_02 = AST::MethodAST::getHeader(node);
  pVVar2 = this->context;
  AST::MethodHeader::getSelector_abi_cxx11_((string *)local_60,this_02);
  aVar10 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::makeSelector(pVVar2,(string *)local_60);
  (this->selector).oop.field_0 = aVar10;
  if ((Pragma *)local_60._0_8_ != (Pragma *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_);
  }
  this_03 = AST::MethodHeader::getArgumentList(this_02);
  if (this_03 == (ArgumentList *)0x0) {
    local_88 = 0;
  }
  else {
    pvVar11 = AST::ArgumentList::getArguments(this_03);
    local_88 = (long)(pvVar11->
                     super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar11->
                     super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  this_04 = AST::MethodAST::getPragmaList(node);
  if ((this_04 == (PragmaList *)0x0) ||
     (pPVar12 = AST::PragmaList::getPragmas(this_04),
     (pPVar12->
     super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
     )._M_impl.super__Vector_impl_data._M_start ==
     (pPVar12->
     super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
     )._M_impl.super__Vector_impl_data._M_finish)) {
    local_80 = 0;
    local_90 = false;
  }
  else {
    local_38 = AST::PragmaList::getPragmas(this_04);
    ppPVar3 = (local_38->
              super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppPVar4 = (local_38->
              super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_80 = (long)ppPVar4 - (long)ppPVar3 >> 3;
    local_60._8_8_ = this->context;
    local_60._0_8_ = &NilObject;
    OopRef::registerSelf((OopRef *)local_60);
    pOVar13 = (ObjectHeader *)AdditionalMethodState::basicNew(this->context,local_80);
    (this->additionalMethodState).reference.oop.field_0.header = pOVar13;
    if (pOVar13 == (ObjectHeader *)&NilObject) goto LAB_00138c15;
    (((Object *)&pOVar13[2].field_0x0)->super_ProtoObject).object_header_ =
         (ObjectHeader)(this->selector).oop.field_0;
    if (ppPVar4 == ppPVar3) {
      local_90 = false;
    }
    else {
      local_40 = local_80 + (local_80 == 0);
      local_90 = false;
      lVar22 = 0;
      do {
        this_00 = (local_38->
                  super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar22];
        psVar14 = AST::PragmaDefinition::getSelectorString_abi_cxx11_(this_00);
        pPVar15 = AST::PragmaDefinition::getParameters(this_00);
        iVar9 = std::__cxx11::string::compare((char *)psVar14);
        if ((iVar9 != 0) && (iVar9 = std::__cxx11::string::compare((char *)psVar14), iVar9 != 0)) {
          iVar9 = std::__cxx11::string::compare((char *)psVar14);
          if ((iVar9 == 0) || (iVar9 = std::__cxx11::string::compare((char *)psVar14), iVar9 == 0))
          {
            local_90 = true;
            MethodAssembler::Assembler::callPrimitive(&this->gen,0x100);
          }
LAB_001388da:
          local_60._0_8_ = Pragma::create(this->context);
          OVar16.field_0 =
               (anon_union_8_4_0eb573b0_for_Oop_0)
               Array::basicNativeNew
                         (this->context,
                          (long)(pPVar15->
                                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pPVar15->
                                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 3);
          if ((Pragma *)local_60._0_8_ != (Pragma *)&NilObject) {
            *(anon_union_8_4_0eb573b0_for_Oop_0 *)(local_60._0_8_ + 0x18) = OVar16.field_0;
            pVVar2 = this->context;
            psVar14 = AST::PragmaDefinition::getSelectorString_abi_cxx11_(this_00);
            aVar10 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::makeByteSymbol(pVVar2,psVar14);
            if ((Pragma *)local_60._0_8_ != (Pragma *)&NilObject) {
              *(anon_union_8_4_0eb573b0_for_Oop_0 *)(local_60._0_8_ + 0x10) = aVar10;
              puVar5 = (this->additionalMethodState).reference.oop.field_0.pointer;
              if (puVar5 == (uint8_t *)&NilObject) goto LAB_00138c15;
              *(undefined8 *)(puVar5 + (lVar22 + 3) * 8) = local_60._0_8_;
              if ((Pragma *)local_60._0_8_ != (Pragma *)&NilObject) {
                lVar23 = ((anon_union_8_4_0eb573b0_for_Oop_0 *)(local_60._0_8_ + 0x18))->uintValue +
                         8;
                if ((((anon_union_8_4_0eb573b0_for_Oop_0 *)(local_60._0_8_ + 0x18))->uintValue & 7)
                    != 0) {
                  lVar23 = 0;
                }
                ppNVar17 = (pPVar15->
                           super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                if ((pPVar15->
                    super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>)
                    ._M_impl.super__Vector_impl_data._M_finish != ppNVar17) {
                  uVar25 = 0;
                  do {
                    this_01 = (LiteralNode *)ppNVar17[uVar25];
                    this_05 = this_01;
                    iVar9 = (*(this_01->super_Node)._vptr_Node[3])();
                    if ((char)iVar9 == '\0') {
                      AbstractASTVisitor::error
                                ((AbstractASTVisitor *)this_05,(Node *)psVar14,
                                 "Expected a literal for the pragma parameters.");
                    }
                    aVar10 = (anon_union_8_4_0eb573b0_for_Oop_0)AST::LiteralNode::getValue(this_01);
                    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar23 + uVar25 * 8) = aVar10;
                    uVar25 = uVar25 + 1;
                    ppNVar17 = (pPVar15->
                               super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                  } while (uVar25 < (ulong)((long)(pPVar15->
                                                  super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                            (long)ppNVar17 >> 3));
                }
                goto LAB_001389c1;
              }
            }
          }
          __function = "T *Lodtalk::Ref<Lodtalk::Pragma>::operator->() const [T = Lodtalk::Pragma]";
          goto LAB_00138c2a;
        }
        iVar9 = (*(*(pPVar15->
                    super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start)->_vptr_Node[3])();
        local_90 = true;
        if (((char)iVar9 != '\0') &&
           (OVar16 = AST::LiteralNode::getValue
                               ((LiteralNode *)
                                *(pPVar15->
                                 super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start),
           ((ulong)OVar16.field_0 & 1) != 0)) {
          local_90 = true;
          MethodAssembler::Assembler::callPrimitive(&this->gen,(int)((ulong)OVar16.field_0 >> 1));
          goto LAB_001388da;
        }
LAB_001389c1:
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_40);
    }
    OopRef::unregisterSelf((OopRef *)local_60);
  }
  pLVar18 = AST::FunctionalNode::getLocalVariables(&node->super_FunctionalNode);
  psVar19 = (pLVar18->
            super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar8 = true;
  lVar22 = (long)(pLVar18->
                 super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)psVar19;
  if (lVar22 == 0) {
LAB_00138a62:
    lVar23 = 0;
    sVar24 = 0;
  }
  else {
    lVar22 = lVar22 >> 4;
    iVar9 = this->temporalVectorCount;
    lVar22 = lVar22 + (ulong)(lVar22 == 0);
    lVar23 = 0;
    do {
      peVar6 = (psVar19->
               super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar6->isCapturedInClosure_ == true) {
        peVar6->temporalVectorIndex = iVar9;
        peVar6->temporalIndex = (int)lVar23;
        lVar23 = lVar23 + 1;
      }
      psVar19 = psVar19 + 1;
      lVar22 = lVar22 + -1;
    } while (lVar22 != 0);
    if (lVar23 == 0) goto LAB_00138a62;
    this->temporalVectorCount = this->temporalVectorCount + 1;
    sVar24 = 1;
    bVar8 = false;
  }
  pLVar20 = AST::FunctionalNode::getLocalVariables(&node->super_FunctionalNode);
  psVar19 = (pLVar20->
            super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar22 = (long)(pLVar20->
                 super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)psVar19;
  if (lVar22 != 0) {
    lVar22 = lVar22 >> 4;
    iVar9 = this->temporalVectorCount;
    uVar25 = 0;
    do {
      peVar6 = (psVar19->
               super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar6->isCapturedInClosure_ == false) {
        if (uVar25 < local_88) {
          peVar6->temporalIndex = (int)uVar25;
        }
        else {
          peVar6->temporalIndex = iVar9 + (int)uVar25;
          sVar24 = sVar24 + 1;
        }
      }
      uVar25 = uVar25 + 1;
      psVar19 = psVar19 + 1;
    } while (lVar22 + (ulong)(lVar22 == 0) != uVar25);
  }
  if (!bVar8) {
    pAVar1 = &this->gen;
    MethodAssembler::Assembler::pushNewArray(pAVar1,(int)lVar23);
    MethodAssembler::Assembler::popStoreTemporal(pAVar1,(int)local_88);
    if (local_88 != 0) {
      lVar22 = 0;
      uVar25 = 0;
      do {
        psVar19 = (pLVar18->
                  super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (*(char *)(*(long *)((long)&(psVar19->
                                       super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + lVar22) + 0x19) == '\x01') {
          MethodAssembler::Assembler::pushTemporal(pAVar1,(int)uVar25);
          lVar23 = *(long *)((long)&(psVar19->
                                    super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar22);
          MethodAssembler::Assembler::popStoreTemporalInVector
                    (pAVar1,*(int *)(lVar23 + 8),*(int *)(lVar23 + 0xc) + (int)local_88);
        }
        uVar25 = uVar25 + 1;
        lVar22 = lVar22 + 0x10;
      } while (local_88 != uVar25);
    }
  }
  pSVar21 = AST::MethodAST::getBody(node);
  (*(pSVar21->super_Node)._vptr_Node[2])(pSVar21,this);
  pAVar1 = &this->gen;
  bVar8 = MethodAssembler::Assembler::isLastReturn(pAVar1);
  if (!bVar8) {
    MethodAssembler::Assembler::returnReceiver(pAVar1);
  }
  OVar16.field_0 =
       (anon_union_8_4_0eb573b0_for_Oop_0)
       (this->additionalMethodState).reference.oop.field_0.pointer;
  if (OVar16.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
    MethodAssembler::Assembler::addLiteralAlways(pAVar1,&this->selector);
  }
  else {
    MethodAssembler::Assembler::addLiteralAlways(pAVar1,OVar16);
  }
  MethodAssembler::Assembler::addLiteralAlways(pAVar1,&this->classBinding);
  OVar16.field_0 =
       (anon_union_8_4_0eb573b0_for_Oop_0)
       MethodAssembler::Assembler::generate(pAVar1,sVar24,local_88,local_90,0);
  puVar7 = (undefined8 *)(this->additionalMethodState).reference.oop.field_0.uintValue;
  if (puVar7 != &NilObject) {
    ((anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar7 + 1))->header = (ObjectHeader *)OVar16.field_0;
    puVar5 = (this->additionalMethodState).reference.oop.field_0.pointer;
    if (puVar5 == (uint8_t *)&NilObject) {
LAB_00138c15:
      __function = 
      "T *Lodtalk::Ref<Lodtalk::AdditionalMethodState>::operator->() const [T = Lodtalk::AdditionalMethodState]"
      ;
LAB_00138c2a:
      __assert_fail("!isNil()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                    ,0x3bf,__function);
    }
    if (local_80 != 0) {
      sVar24 = 0;
      do {
        ((anon_union_8_4_0eb573b0_for_Oop_0 *)(*(long *)(puVar5 + (sVar24 + 3) * 8) + 8))->header =
             (ObjectHeader *)OVar16.field_0;
        sVar24 = sVar24 + 1;
      } while (local_80 != sVar24);
    }
  }
  return (Oop)OVar16.field_0;
}

Assistant:

Oop MethodCompiler::visitMethodAST(MethodAST *node)
{
    size_t temporalCount = 0;
    size_t argumentCount = 0;

    // Set the local context
    localContext = node;
    temporalVectorCount = 0;

	// Get the method selector.
	auto header = node->getHeader();
	selector = context->makeSelector(header->getSelector());

	// Process the arguments
	auto argumentList = header->getArgumentList();
	if(argumentList)
        argumentCount = argumentList->getArguments().size();

    // Process the pragmas.
    // Vist the pragmas
    auto pragmaList = node->getPragmaList();
    bool hasPrimitive = false;
    size_t pragmaCount = 0;
    if(pragmaList && !pragmaList->getPragmas().empty())
    {
        auto &pragmas = pragmaList->getPragmas();
        pragmaCount = pragmas.size();

        Ref<Pragma> pragmaObject(context);

        additionalMethodState = AdditionalMethodState::basicNew(context, pragmaCount);
        additionalMethodState->setSelector(selector.oop);

        for(size_t i = 0; i < pragmaCount; ++i)
        {
            auto pragma = pragmas[i];
            auto &selector = pragma->getSelectorString();
            auto &params = pragma->getParameters();
            if(selector == "primitive:" || selector == "primitive:error:")
            {
                // Numbered primitive.
                hasPrimitive = true;

                // Ensure the number parameter is a literal
                auto numberParam = params[0];
                if(!numberParam->isLiteral())
                    continue;

                // Read the number parameter.
                auto numberParamLiteral = static_cast<LiteralNode*> (params[0]);
                auto number = numberParamLiteral->getValue();
                if(!number.isSmallInteger())
                    continue;

                // Call the primitive.
                hasPrimitive = true;
                gen.callPrimitive((int)number.decodeSmallInteger());
            }
            else if(selector == "primitive:module:" || selector == "primitive:module:error:")
            {
                // Named primitive.
                hasPrimitive = true;
                gen.callPrimitive(256);
            }

            // Create the pragma.
            pragmaObject = Pragma::create(context);
            pragmaObject->arguments = Oop::fromPointer(Array::basicNativeNew(context, params.size()));
            pragmaObject->keyword = context->makeByteSymbol(pragma->getSelectorString());
            additionalMethodState->getIndexableElements()[i] = pragmaObject.getOop();

            // Set the arguments.
            auto argumentsData = reinterpret_cast<Oop*> (pragmaObject->arguments.getFirstFieldPointer());
            for(size_t j = 0; j < params.size(); ++j)
            {
                auto paramNode = params[j];
                if(!paramNode->isLiteral())
                    error(paramNode, "Expected a literal for the pragma parameters.");

                auto paramLiteralNode = static_cast<LiteralNode*> (paramNode);
                argumentsData[j] = paramLiteralNode->getValue();
            }
        }
    }

    // Count the captured variables.
    auto &blockLocals = node->getLocalVariables();
    size_t capturedCount = 0;
    for(size_t i = 0; i < blockLocals.size(); ++i)
    {
        auto &localVar = blockLocals[i];
        if(localVar->isCapturedInClosure())
        {
            localVar->setTemporalVectorIndex(temporalVectorCount);
            localVar->setTemporalIndex(int(capturedCount++));
        }
    }

    if(capturedCount)
    {
        ++temporalVectorCount;
        ++temporalCount;
    }

    // Compute the local variables indices.
    auto &localVars = node->getLocalVariables();
    for(size_t i = 0; i < localVars.size(); ++i)
    {
        auto &localVar = localVars[i];
        if(!localVar->isCapturedInClosure())
        {
            if(i < argumentCount)
                localVar->setTemporalIndex((int)i);
            else
            {
                localVar->setTemporalIndex(int(i + temporalVectorCount));
                ++temporalCount;
            }
        }
    }

    // Create the temporal vector
    if(capturedCount)
    {
        gen.pushNewArray((int)capturedCount);
        gen.popStoreTemporal((int)argumentCount);

        // Copy the captured arguments into the temp vector
        for(size_t i = 0; i < argumentCount; ++i)
        {
            auto &localVar = blockLocals[i];
            if(localVar->isCapturedInClosure())
            {
                gen.pushTemporal((int)i);
                gen.popStoreTemporalInVector(localVar->getTemporalIndex(), int(argumentCount + localVar->getTemporalVectorIndex()));
            }
        }
    }

	// Visit the method body
	node->getBody()->acceptVisitor(this);

	// Always return
	if(!gen.isLastReturn())
		gen.returnReceiver();

	// Set the method selector/additonal method state.
    if(!additionalMethodState.isNil())
        gen.addLiteralAlways(additionalMethodState.getOop());
    else
        gen.addLiteralAlways(selector);

	// Set the class binding.
	gen.addLiteralAlways(classBinding);
	Oop result = Oop::fromPointer(gen.generate(temporalCount, argumentCount, hasPrimitive));

    // Set some back pointers.
    if(!additionalMethodState.isNil())
    {
        additionalMethodState->setMethod(result);
        auto pragmas = additionalMethodState->getIndexableElements();
        for(size_t i = 0; i < pragmaCount; ++i)
        {
            auto pragma = reinterpret_cast<Pragma*> (pragmas[i].pointer);
            pragma->method = result;
        }
    }

    return result;
}